

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O3

void zlsolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  doublecomplex *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  uVar8 = 0;
  if (3 < ncol) {
    lVar7 = (long)ldm;
    lVar13 = (long)(ldm * 4 + 4);
    pdVar9 = rhs + 4;
    pdVar15 = &M[lVar7 + 4].i;
    pdVar16 = &M[lVar7 * 2 + 4].i;
    pdVar10 = &M[lVar7 * 3 + 4].i;
    uVar14 = 4;
    uVar8 = 0;
    do {
      dVar4 = rhs[uVar8].r;
      dVar5 = rhs[uVar8].i;
      dVar23 = -dVar5;
      dVar17 = rhs[uVar8 + 1].r - (M[1].r * dVar4 + M[1].i * dVar23);
      dVar18 = rhs[uVar8 + 1].i - (M[1].r * dVar5 + M[1].i * dVar4);
      dVar24 = -dVar18;
      dVar19 = (rhs[uVar8 + 2].r - (M[2].r * dVar4 + M[2].i * dVar23)) -
               (M[lVar7 + 2].r * dVar17 + M[lVar7 + 2].i * dVar24);
      dVar20 = (rhs[uVar8 + 2].i - (M[2].r * dVar5 + M[2].i * dVar4)) -
               (M[lVar7 + 2].r * dVar18 + M[lVar7 + 2].i * dVar17);
      dVar21 = ((rhs[uVar8 + 3].r - (M[3].r * dVar4 + M[3].i * dVar23)) -
               (M[lVar7 + 3].r * dVar17 + M[lVar7 + 3].i * dVar24)) -
               (M[lVar7 * 2 + 3].r * dVar19 + M[lVar7 * 2 + 3].i * -dVar20);
      dVar22 = ((rhs[uVar8 + 3].i - (M[3].r * dVar5 + M[3].i * dVar4)) -
               (M[lVar7 + 3].r * dVar18 + M[lVar7 + 3].i * dVar17)) -
               (M[lVar7 * 2 + 3].r * dVar20 + M[lVar7 * 2 + 3].i * dVar19);
      rhs[uVar8 + 1].r = dVar17;
      rhs[uVar8 + 1].i = dVar18;
      rhs[uVar8 + 2].r = dVar19;
      rhs[uVar8 + 2].i = dVar20;
      rhs[uVar8 + 3].r = dVar21;
      rhs[uVar8 + 3].i = dVar22;
      uVar8 = uVar8 + 4;
      if (uVar8 < (uint)ncol) {
        lVar11 = 0;
        uVar12 = (ulong)(uint)ncol;
        do {
          dVar2 = *(double *)((long)&M[4].r + lVar11);
          dVar3 = *(double *)((long)&M[4].i + lVar11);
          pdVar1 = (double *)((long)&pdVar9->r + lVar11);
          dVar25 = *pdVar1 - (dVar2 * dVar4 + dVar3 * dVar23);
          dVar26 = pdVar1[1] - (dVar2 * dVar5 + dVar3 * dVar4);
          pdVar1 = (double *)((long)&pdVar9->r + lVar11);
          *pdVar1 = dVar25;
          pdVar1[1] = dVar26;
          dVar2 = *(double *)((long)pdVar15 + lVar11 + -8);
          dVar25 = dVar25 - (dVar2 * dVar17 + *(double *)((long)pdVar15 + lVar11) * dVar24);
          dVar26 = dVar26 - (dVar2 * dVar18 + *(double *)((long)pdVar15 + lVar11) * dVar17);
          pdVar1 = (double *)((long)&pdVar9->r + lVar11);
          *pdVar1 = dVar25;
          pdVar1[1] = dVar26;
          dVar2 = *(double *)((long)pdVar16 + lVar11 + -8);
          dVar25 = dVar25 - (dVar2 * dVar19 + *(double *)((long)pdVar16 + lVar11) * -dVar20);
          dVar26 = dVar26 - (dVar2 * dVar20 + *(double *)((long)pdVar16 + lVar11) * dVar19);
          pdVar1 = (double *)((long)&pdVar9->r + lVar11);
          *pdVar1 = dVar25;
          pdVar1[1] = dVar26;
          dVar2 = *(double *)((long)pdVar10 + lVar11 + -8);
          dVar3 = *(double *)((long)pdVar10 + lVar11);
          pdVar1 = (double *)((long)&pdVar9->r + lVar11);
          *pdVar1 = dVar25 - (dVar2 * dVar21 + dVar3 * -dVar22);
          pdVar1[1] = dVar26 - (dVar2 * dVar22 + dVar3 * dVar21);
          lVar11 = lVar11 + 0x10;
          uVar12 = uVar12 - 1;
        } while (uVar14 != uVar12);
      }
      M = M + lVar13;
      uVar14 = uVar14 + 4;
      pdVar9 = pdVar9 + 4;
      pdVar15 = pdVar15 + lVar13 * 2;
      pdVar16 = pdVar16 + lVar13 * 2;
      pdVar10 = pdVar10 + lVar13 * 2;
    } while (uVar8 < ncol - 3);
  }
  uVar6 = (uint)uVar8;
  if ((int)uVar6 < ncol + -1) {
    uVar8 = uVar8 & 0xffffffff;
    dVar4 = rhs[uVar8].r;
    dVar5 = rhs[uVar8].i;
    dVar17 = rhs[uVar6 | 1].r - (M[1].r * dVar4 + M[1].i * -dVar5);
    dVar18 = rhs[uVar6 | 1].i - (M[1].r * dVar5 + M[1].i * dVar4);
    rhs[uVar6 | 1].r = dVar17;
    rhs[uVar6 | 1].i = dVar18;
    if ((int)(uVar6 | 2) < ncol) {
      pdVar9 = rhs + uVar8 + 2;
      lVar7 = ((uint)ncol - uVar8) + -2;
      pdVar10 = &M[2].i;
      do {
        dVar21 = pdVar9->r - (((doublecomplex *)(pdVar10 + -1))->r * dVar4 + *pdVar10 * -dVar5);
        dVar22 = pdVar9->i - (((doublecomplex *)(pdVar10 + -1))->r * dVar5 + *pdVar10 * dVar4);
        pdVar9->r = dVar21;
        pdVar9->i = dVar22;
        dVar19 = pdVar10[(long)ldm * 2 + -1];
        dVar20 = pdVar10[(long)ldm * 2];
        pdVar9->r = dVar21 - (dVar19 * dVar17 + dVar20 * -dVar18);
        pdVar9->i = dVar22 - (dVar19 * dVar18 + dVar20 * dVar17);
        pdVar9 = pdVar9 + 1;
        pdVar10 = pdVar10 + 2;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  return;
}

Assistant:

void zlsolve ( int ldm, int ncol, doublecomplex *M, doublecomplex *rhs )
{
    int k;
    doublecomplex x0, x1, x2, x3, temp;
    doublecomplex *M0;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	zz_mult(&temp, &x0, Mki0); Mki0++;
      	z_sub(&x1, &rhs[firstcol+1], &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x2, &rhs[firstcol+2], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x2, &x2, &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x3, &rhs[firstcol+3], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x3, &x3, &temp);
	zz_mult(&temp, &x2, Mki2); Mki2++;
	z_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x2, Mki2); Mki2++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x3, Mki3); Mki3++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}